

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  N_Vector u;
  long lVar3;
  SUNLinearSolver LS;
  SUNMatrix J;
  void *kmem;
  int retval;
  N_Vector scale;
  N_Vector y;
  sunrealtype fnorm;
  sunrealtype fnormtol;
  SUNContext sunctx;
  int in_stack_ffffffffffffffac;
  char *pcVar4;
  void *pvVar5;
  undefined8 local_40;
  undefined4 local_34;
  void *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_40 = 0;
  pvVar5 = (void *)0x0;
  pcVar4 = (char *)0x0;
  printf("\n2D elliptic PDE on unit square\n");
  printf("   d^2 u / dx^2 + d^2 u / dy^2 = u^3 - u + 2.0\n");
  printf(" + homogeneous Dirichlet boundary conditions\n\n");
  printf("Solution method: Anderson accelerated Picard iteration with band linear solver.\n");
  printf("Problem size: %2ld x %2ld = %4ld\n",0x1f,0x1f,0x3c1);
  local_34 = SUNContext_Create(0,&local_10);
  iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
  if (iVar1 == 0) {
    uVar2 = N_VNew_Serial(0x3c1,local_10);
    iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
    if (iVar1 == 0) {
      u = (N_Vector)N_VNew_Serial(0x3c1,local_10);
      iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
      if (iVar1 == 0) {
        local_40 = KINCreate(local_10);
        iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
        if (iVar1 == 0) {
          local_34 = KINSetMAA(local_40,3);
          iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
          if (iVar1 == 0) {
            local_34 = KINInit(local_40,func,uVar2);
            iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
            if (iVar1 == 0) {
              local_34 = KINSetFuncNormTol(0x3d719799812dea11,local_40);
              iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
              if (iVar1 == 0) {
                pvVar5 = (void *)SUNBandMatrix(0x3c1,0x1f,0x1f,local_10);
                iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
                if (iVar1 == 0) {
                  pcVar4 = (char *)SUNLinSol_Band(uVar2,pvVar5,local_10);
                  iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
                  if (iVar1 == 0) {
                    local_34 = KINSetLinearSolver(local_40,pcVar4,pvVar5);
                    iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
                    if (iVar1 == 0) {
                      local_34 = KINSetJacFn(local_40,jac);
                      iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
                      if (iVar1 == 0) {
                        N_VConst(0,uVar2);
                        lVar3 = N_VGetArrayPointer(uVar2);
                        *(undefined8 *)(lVar3 + 0x100) = 0x3ff0000000000000;
                        N_VConst(0x3ff0000000000000,u);
                        local_34 = KINSol(local_40,uVar2,2,u,u);
                        iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
                        if (iVar1 == 0) {
                          local_34 = KINGetFuncNorm(local_40,&stack0xffffffffffffffe0);
                          iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffffac);
                          if (iVar1 == 0) {
                            printf("\nComputed solution (||F|| = %g):\n\n",in_stack_ffffffffffffffe0
                                  );
                            PrintOutput(u);
                            PrintFinalStats(in_stack_ffffffffffffffe0);
                            N_VDestroy(uVar2);
                            N_VDestroy(u);
                            KINFree(&local_40);
                            SUNLinSolFree(pcVar4);
                            SUNMatDestroy(pvVar5);
                            SUNContext_Free(&local_10);
                            local_4 = 0;
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, fnorm;
  N_Vector y, scale;
  int retval;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;

  y = scale = NULL;
  kmem      = NULL;
  J         = NULL;
  LS        = NULL;

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("\n2D elliptic PDE on unit square\n");
  printf("   d^2 u / dx^2 + d^2 u / dy^2 = u^3 - u + 2.0\n");
  printf(" + homogeneous Dirichlet boundary conditions\n\n");
  printf("Solution method: Anderson accelerated Picard iteration with band "
         "linear solver.\n");
  printf("Problem size: %2ld x %2ld = %4ld\n", (long int)NX, (long int)NY,
         (long int)NEQ);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  /* ----------------------------------------------------------------------------------
   * Initialize and allocate memory for KINSOL, set parametrs for Anderson acceleration
   * ---------------------------------------------------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* y is used as a template */

  /* Use acceleration with up to 3 prior residuals */
  retval = KINSetMAA(kmem, 3);
  if (check_retval(&retval, "KINSetMAA", 1)) { return (1); }

  retval = KINInit(kmem, func, y);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */

  fnormtol = FTOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* -------------------------
   * Create band SUNMatrix
   * ------------------------- */

  J = SUNBandMatrix(NEQ, NX, NX, sunctx);
  if (check_retval((void*)J, "SUNBandMatrix", 0)) { return (1); }

  /* ---------------------------
   * Create band SUNLinearSolver
   * --------------------------- */

  LS = SUNLinSol_Band(y, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* -------------------------
   * Attach band linear solver
   * ------------------------- */

  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* -------------------------
   * Set Jacobian function
   * ------------------------- */

  retval = KINSetJacFn(kmem, jac);
  if (check_retval(&retval, "KINSetJacFn", 1)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  N_VConst(ZERO, y);
  IJth(N_VGetArrayPointer(y), 2, 2) = ONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,       /* KINSol memory block */
                  y,          /* initial guess on input; solution vector */
                  KIN_PICARD, /* global strategy choice */
                  scale,      /* scaling vector, for the variable cc */
                  scale);     /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Print solution and solver statistics
   * ------------------------------------ */

  /* Get scaled norm of the system function */

  retval = KINGetFuncNorm(kmem, &fnorm);
  if (check_retval(&retval, "KINGetfuncNorm", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\nComputed solution (||F|| = %Lg):\n\n", fnorm);
#else
  printf("\nComputed solution (||F|| = %g):\n\n", fnorm);
#endif
  PrintOutput(y);

  PrintFinalStats(kmem);

  /* -----------
   * Free memory
   * ----------- */

  N_VDestroy(y);
  N_VDestroy(scale);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  SUNContext_Free(&sunctx);

  return (0);
}